

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmaster.c
# Opt level: O0

void jpeg_calc_output_dimensions(j_decompress_ptr cinfo)

{
  boolean bVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  int local_34;
  int local_24;
  jpeg_component_info *pjStack_20;
  int ssize;
  jpeg_component_info *compptr;
  int ci;
  j_decompress_ptr cinfo_local;
  
  if (cinfo->global_state != 0xca) {
    cinfo->err->msg_code = 0x15;
    (cinfo->err->msg_parm).i[0] = cinfo->global_state;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  jpeg_core_output_dimensions(cinfo);
  compptr._4_4_ = 0;
  pjStack_20 = cinfo->comp_info;
  for (; compptr._4_4_ < cinfo->num_components; compptr._4_4_ = compptr._4_4_ + 1) {
    local_24 = 1;
    while( true ) {
      iVar4 = 4;
      if (cinfo->do_fancy_upsampling != 0) {
        iVar4 = 8;
      }
      bVar5 = false;
      if (cinfo->min_DCT_h_scaled_size * local_24 <= iVar4) {
        bVar5 = cinfo->max_h_samp_factor % (pjStack_20->h_samp_factor * local_24 * 2) == 0;
      }
      if (!bVar5) break;
      local_24 = local_24 << 1;
    }
    pjStack_20->DCT_h_scaled_size = cinfo->min_DCT_h_scaled_size * local_24;
    local_24 = 1;
    while( true ) {
      iVar4 = 4;
      if (cinfo->do_fancy_upsampling != 0) {
        iVar4 = 8;
      }
      bVar5 = false;
      if (cinfo->min_DCT_v_scaled_size * local_24 <= iVar4) {
        bVar5 = cinfo->max_v_samp_factor % (pjStack_20->v_samp_factor * local_24 * 2) == 0;
      }
      if (!bVar5) break;
      local_24 = local_24 << 1;
    }
    pjStack_20->DCT_v_scaled_size = cinfo->min_DCT_v_scaled_size * local_24;
    iVar4 = pjStack_20->DCT_h_scaled_size;
    iVar3 = pjStack_20->DCT_v_scaled_size * 2;
    if (iVar4 == iVar3 || SBORROW4(iVar4,iVar3) != iVar4 + pjStack_20->DCT_v_scaled_size * -2 < 0) {
      iVar4 = pjStack_20->DCT_v_scaled_size;
      iVar3 = pjStack_20->DCT_h_scaled_size * 2;
      if (iVar4 != iVar3 && SBORROW4(iVar4,iVar3) == iVar4 + pjStack_20->DCT_h_scaled_size * -2 < 0)
      {
        pjStack_20->DCT_v_scaled_size = pjStack_20->DCT_h_scaled_size << 1;
      }
    }
    else {
      pjStack_20->DCT_h_scaled_size = pjStack_20->DCT_v_scaled_size << 1;
    }
    pjStack_20 = pjStack_20 + 1;
  }
  compptr._4_4_ = 0;
  pjStack_20 = cinfo->comp_info;
  for (; compptr._4_4_ < cinfo->num_components; compptr._4_4_ = compptr._4_4_ + 1) {
    lVar2 = jdiv_round_up((ulong)cinfo->image_width *
                          (long)(pjStack_20->h_samp_factor * pjStack_20->DCT_h_scaled_size),
                          (long)(cinfo->max_h_samp_factor * cinfo->block_size));
    pjStack_20->downsampled_width = (JDIMENSION)lVar2;
    lVar2 = jdiv_round_up((ulong)cinfo->image_height *
                          (long)(pjStack_20->v_samp_factor * pjStack_20->DCT_v_scaled_size),
                          (long)(cinfo->max_v_samp_factor * cinfo->block_size));
    pjStack_20->downsampled_height = (JDIMENSION)lVar2;
    pjStack_20 = pjStack_20 + 1;
  }
  switch(cinfo->out_color_space) {
  case JCS_GRAYSCALE:
    cinfo->out_color_components = 1;
    break;
  case JCS_RGB:
    cinfo->out_color_components = 3;
    break;
  case JCS_YCbCr:
    cinfo->out_color_components = 3;
    break;
  case JCS_CMYK:
  case JCS_YCCK:
    cinfo->out_color_components = 4;
    break;
  default:
    cinfo->out_color_components = cinfo->num_components;
  }
  if (cinfo->quantize_colors == 0) {
    local_34 = cinfo->out_color_components;
  }
  else {
    local_34 = 1;
  }
  cinfo->output_components = local_34;
  bVar1 = use_merged_upsample(cinfo);
  if (bVar1 == 0) {
    cinfo->rec_outbuf_height = 1;
  }
  else {
    cinfo->rec_outbuf_height = cinfo->max_v_samp_factor;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_calc_output_dimensions (j_decompress_ptr cinfo)
/* Do computations that are needed before master selection phase.
 * This function is used for full decompression.
 */
{
#ifdef IDCT_SCALING_SUPPORTED
  int ci;
  jpeg_component_info *compptr;
#endif

  /* Prevent application from calling me at wrong times */
  if (cinfo->global_state != DSTATE_READY)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  /* Compute core output image dimensions and DCT scaling choices. */
  jpeg_core_output_dimensions(cinfo);

#ifdef IDCT_SCALING_SUPPORTED

  /* In selecting the actual DCT scaling for each component, we try to
   * scale up the chroma components via IDCT scaling rather than upsampling.
   * This saves time if the upsampler gets to use 1:1 scaling.
   * Note this code adapts subsampling ratios which are powers of 2.
   */
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    int ssize = 1;
    while (cinfo->min_DCT_h_scaled_size * ssize <=
	   (cinfo->do_fancy_upsampling ? DCTSIZE : DCTSIZE / 2) &&
	   (cinfo->max_h_samp_factor % (compptr->h_samp_factor * ssize * 2)) == 0) {
      ssize = ssize * 2;
    }
    compptr->DCT_h_scaled_size = cinfo->min_DCT_h_scaled_size * ssize;
    ssize = 1;
    while (cinfo->min_DCT_v_scaled_size * ssize <=
	   (cinfo->do_fancy_upsampling ? DCTSIZE : DCTSIZE / 2) &&
	   (cinfo->max_v_samp_factor % (compptr->v_samp_factor * ssize * 2)) == 0) {
      ssize = ssize * 2;
    }
    compptr->DCT_v_scaled_size = cinfo->min_DCT_v_scaled_size * ssize;

    /* We don't support IDCT ratios larger than 2. */
    if (compptr->DCT_h_scaled_size > compptr->DCT_v_scaled_size * 2)
	compptr->DCT_h_scaled_size = compptr->DCT_v_scaled_size * 2;
    else if (compptr->DCT_v_scaled_size > compptr->DCT_h_scaled_size * 2)
	compptr->DCT_v_scaled_size = compptr->DCT_h_scaled_size * 2;
  }

  /* Recompute downsampled dimensions of components;
   * application needs to know these if using raw downsampled data.
   */
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Size in samples, after IDCT scaling */
    compptr->downsampled_width = (JDIMENSION)
      jdiv_round_up((long) cinfo->image_width *
		    (long) (compptr->h_samp_factor * compptr->DCT_h_scaled_size),
		    (long) (cinfo->max_h_samp_factor * cinfo->block_size));
    compptr->downsampled_height = (JDIMENSION)
      jdiv_round_up((long) cinfo->image_height *
		    (long) (compptr->v_samp_factor * compptr->DCT_v_scaled_size),
		    (long) (cinfo->max_v_samp_factor * cinfo->block_size));
  }

#endif /* IDCT_SCALING_SUPPORTED */

  /* Report number of components in selected colorspace. */
  /* Probably this should be in the color conversion module... */
  switch (cinfo->out_color_space) {
  case JCS_GRAYSCALE:
    cinfo->out_color_components = 1;
    break;
  case JCS_RGB:
    cinfo->out_color_components = RGB_PIXELSIZE;
    break;
  case JCS_YCbCr:
    cinfo->out_color_components = 3;
    break;
  case JCS_CMYK:
  case JCS_YCCK:
    cinfo->out_color_components = 4;
    break;
  default:			/* else must be same colorspace as in file */
    cinfo->out_color_components = cinfo->num_components;
    break;
  }
  cinfo->output_components = (cinfo->quantize_colors ? 1 :
			      cinfo->out_color_components);

  /* See if upsampler will want to emit more than one row at a time */
  if (use_merged_upsample(cinfo))
    cinfo->rec_outbuf_height = cinfo->max_v_samp_factor;
  else
    cinfo->rec_outbuf_height = 1;
}